

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnStream.cpp
# Opt level: O1

bool __thiscall
tfs::OutDnnStream::writeArray(OutDnnStream *this,unsigned_long *array,unsigned_long count)

{
  bool bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  unsigned_long line;
  char *format;
  undefined1 local_25;
  undefined4 local_24;
  unsigned_long local_20;
  
  local_24 = 4;
  sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,(int)&local_24,(void *)0x4,in_RCX);
  if ((char)sVar2 == '\0') {
    format = "Unable to write matrix";
    line = 0xa8;
  }
  else {
    local_25 = array == (unsigned_long *)0x0;
    sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,(int)&local_25,(void *)0x1,in_RCX);
    if ((char)sVar2 == '\0') {
      format = "Unable to write array null / not null boolean";
      line = 0xac;
    }
    else {
      if (array == (unsigned_long *)0x0) {
        return true;
      }
      local_20 = count;
      sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,(int)&local_20,(void *)0x8,in_RCX)
      ;
      if ((char)sVar2 != '\0') {
        sVar2 = OutBinaryStream::write
                          (&this->super_OutBinaryStream,(int)array,(void *)(count << 3),in_RCX);
        return (bool)(char)sVar2;
      }
      format = "Unable to write array count";
      line = 0xb2;
    }
  }
  bVar1 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnStream.cpp"
                         ,"writeArray",line,format);
  return bVar1;
}

Assistant:

bool
    OutDnnStream::writeArray( const unsigned long *array, const unsigned long count ) {
        if( !write( OBJECT_ARRAY_UNSIGNED_LONG )) {
            return log_error( "Unable to write matrix" );
        }
        const bool arrayIsNull = array == 0;
        if( !write( arrayIsNull )) {
            return log_error( "Unable to write array null / not null boolean" );
        }
        if( arrayIsNull ) {
            return true;            // Our work here is done.
        }
        if( !write( count )) {
            return log_error( "Unable to write array count" );
        }
        return write( array, count );
    }